

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<7,_4>::Type
          (Type<7,_4> *this,int zaid,double awr,int lat,int lasym,ScatteringLawConstants *constants,
          ScatteringLaw *law,EffectiveTemperature *principal,
          vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
          *secondaries)

{
  _Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  *p_Var1;
  int value;
  double dVar2;
  pointer pdVar3;
  pointer plVar4;
  pointer poVar5;
  long lVar6;
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>
  local_58;
  
  BaseWithoutMT<njoy::ENDFtk::section::Type<7,_4>_>::BaseWithoutMT
            (&this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_4>_>,zaid,awr);
  this->lat_ = lat;
  this->lasym_ = lasym;
  *(undefined8 *)
   &(this->b_).super_ListRecord.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> =
       *(undefined8 *)
        &(constants->super_ListRecord).metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->b_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(constants->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->b_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(constants->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  dVar2 = (constants->super_ListRecord).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->b_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       (constants->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  (this->b_).super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = dVar2;
  (this->b_).super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (constants->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  pdVar3 = (constants->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->b_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (constants->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->b_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar3;
  (this->b_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (constants->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (constants->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (constants->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (constants->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     *)&this->law_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     *)law);
  *(undefined8 *)
   &(this->principal_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long> =
       *(undefined8 *)
        &(principal->super_TabulationRecord).super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->principal_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(principal->super_TabulationRecord).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->principal_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(principal->super_TabulationRecord).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  dVar2 = (principal->super_TabulationRecord).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->principal_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       ((_Head_base<2UL,_long,_false> *)
       ((long)&(principal->super_TabulationRecord).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->principal_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl = dVar2;
  (this->principal_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (principal->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  plVar4 = (principal->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (this->principal_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (principal->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->principal_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       plVar4;
  *(pointer *)
   ((long)&(this->principal_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       (principal->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (principal->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (principal->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (principal->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  plVar4 = (principal->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (this->principal_).super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (principal->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->principal_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 8) = plVar4;
  *(pointer *)
   ((long)&(this->principal_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       (principal->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (principal->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (principal->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (principal->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  pdVar3 = (principal->super_TabulationRecord).xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->principal_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (principal->super_TabulationRecord).xValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start;
  (this->principal_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       pdVar3;
  (this->principal_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (principal->super_TabulationRecord).xValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (principal->super_TabulationRecord).xValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (principal->super_TabulationRecord).xValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (principal->super_TabulationRecord).xValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar3 = (principal->super_TabulationRecord).yValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->principal_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (principal->super_TabulationRecord).yValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start;
  (this->principal_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       pdVar3;
  (this->principal_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (principal->super_TabulationRecord).yValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (principal->super_TabulationRecord).yValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (principal->super_TabulationRecord).yValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (principal->super_TabulationRecord).yValues.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  poVar5 = (secondaries->
           super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->secondary_).
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (secondaries->
       super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->secondary_).
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = poVar5;
  (this->secondary_).
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (secondaries->
       super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (secondaries->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (secondaries->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (secondaries->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  .
  super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  .rng_.data_.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  ._M_head_impl._M_current =
       (_Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
        )(this->b_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  .
  super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  .rng_.data_.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  ._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       ((this->b_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_start + 6);
  local_58.
  super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  .stride_ = 6;
  lVar6 = ((long)local_58.
                 super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                 .
                 super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                 .rng_.data_.
                 super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                 .
                 super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                 .
                 super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                 ._M_head_impl._M_current -
           (long)local_58.
                 super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                 .
                 super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                 .rng_.data_.
                 super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                 .
                 super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                 ._M_head_impl._M_current >> 3) % 6;
  local_58.
  super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  .offset_ = 6 - lVar6;
  if (lVar6 == 0) {
    local_58.
    super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
    .offset_ = 0;
  }
  Type<7,4>::
  verifySecondaryTemperatures<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,std::vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>>
            (&local_58,&this->secondary_);
  value = this->lat_;
  p_Var1 = (_Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
            *)((long)&local_58.
                      super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                      .
                      super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                      .rng_.data_.
                      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              + 8);
  local_58.
  super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  .
  super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  ._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"LAT","");
  checkValue(value,(string *)&local_58);
  if ((_Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
       *)local_58.
         super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
         .
         super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
         ._0_8_ != p_Var1) {
    operator_delete((void *)local_58.
                            super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                            .
                            super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                            ._0_8_,
                    (long)local_58.
                          super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                          .
                          super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                          .rng_.data_.
                          super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                          .
                          super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                          ._M_head_impl._M_current + 1);
  }
  return;
}

Assistant:

Type( int zaid, double awr, int lat, int lasym,
      ScatteringLawConstants&& constants,
      ScatteringLaw&& law,
      EffectiveTemperature&& principal,
      std::vector< std::optional< EffectiveTemperature > >
          secondaries = {} ) :
  BaseWithoutMT( zaid, awr ), lat_( lat ), lasym_( lasym ),
  b_( std::move( constants ) ), law_( std::move( law ) ),
  principal_( std::move( principal ) ),
  secondary_( std::move( secondaries ) ) {

  verifySecondaryTemperatures( this->b_.analyticalFunctionTypes(),
                               this->secondary_ );
  checkValue( this->LAT(), "LAT" );
}